

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlCopyCharMultiByte(xmlChar *out,int val)

{
  bool bVar1;
  uint uVar2;
  sbyte sVar3;
  byte bVar4;
  long lVar5;
  
  lVar5 = 0;
  if (-1 < val && out != (xmlChar *)0x0) {
    if ((uint)val < 0x80) {
      *out = (xmlChar)val;
      lVar5 = 1;
    }
    else {
      if ((uint)val < 0x800) {
        uVar2 = 0;
        bVar4 = 0xc0;
        sVar3 = 6;
      }
      else if ((uint)val < 0x10000) {
        uVar2 = 6;
        bVar4 = 0xe0;
        sVar3 = 0xc;
      }
      else {
        if (0x10ffff < (uint)val) {
          lVar5 = 0;
          __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                          (void *)0x0,(void *)0x0,1,9,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,
                          (char *)0x0,(char *)0x0,val,0,
                          "Internal error, xmlCopyCharMultiByte 0x%X out of bound\n",val);
          goto LAB_00169fe2;
        }
        uVar2 = 0xc;
        bVar4 = 0xf0;
        sVar3 = 0x12;
      }
      *out = (byte)((uint)val >> sVar3) | bVar4;
      lVar5 = 1;
      do {
        out[lVar5] = (byte)((uint)val >> ((byte)uVar2 & 0x1f)) & 0x3f | 0x80;
        lVar5 = lVar5 + 1;
        bVar1 = 5 < uVar2;
        uVar2 = uVar2 - 6;
      } while (bVar1);
    }
  }
LAB_00169fe2:
  return (int)lVar5;
}

Assistant:

int
xmlCopyCharMultiByte(xmlChar *out, int val) {
    if ((out == NULL) || (val < 0)) return(0);
    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     */
    if  (val >= 0x80) {
	xmlChar *savedout = out;
	int bits;
	if (val <   0x800) { *out++= (val >>  6) | 0xC0;  bits=  0; }
	else if (val < 0x10000) { *out++= (val >> 12) | 0xE0;  bits=  6;}
	else if (val < 0x110000)  { *out++= (val >> 18) | 0xF0;  bits=  12; }
	else {
	    xmlErrEncodingInt(NULL, XML_ERR_INVALID_CHAR,
		    "Internal error, xmlCopyCharMultiByte 0x%X out of bound\n",
			      val);
	    return(0);
	}
	for ( ; bits >= 0; bits-= 6)
	    *out++= ((val >> bits) & 0x3F) | 0x80 ;
	return (out - savedout);
    }
    *out = val;
    return 1;
}